

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall
QTableViewPrivate::drawCell
          (QTableViewPrivate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  QWidget *this_00;
  Data *pDVar1;
  QModelIndex *pQVar2;
  QAbstractItemModel *pQVar3;
  char cVar4;
  ulong uVar5;
  QStyle *pQVar6;
  long *plVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QStyleOptionViewItem opt;
  QModelIndex local_120;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108,option);
  pDVar1 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.d;
  if ((pDVar1 != (Data *)0x0) &&
     (pQVar2 = (QModelIndex *)(this->super_QAbstractItemViewPrivate).selectionModel.wp.value,
     pQVar2 != (QModelIndex *)0x0 && *(int *)(pDVar1 + 4) != 0)) {
    cVar4 = QItemSelectionModel::isSelected(pQVar2);
    if (cVar4 != '\0') {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
           local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x80;
    }
  }
  cVar4 = comparesEqual(&(this->super_QAbstractItemViewPrivate).hover,index);
  if (cVar4 != '\0') {
    local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
         local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x20;
  }
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 1) != 0) {
    pQVar3 = (this->super_QAbstractItemViewPrivate).model;
    uVar5 = (**(code **)(*(long *)pQVar3 + 0x138))(pQVar3,index);
    bVar8 = (uVar5 & 0x20) == 0;
    if (bVar8) {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i._0_1_ =
           (byte)local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                 super_QFlagsStorage<QStyle::StateFlag>.i & 0xfe;
    }
    local_108.super_QStyleOption.palette.currentGroup = (ColorGroup)bVar8;
  }
  QAbstractItemView::currentIndex(&local_120,(QAbstractItemView *)this_00);
  if ((((index->r == local_120.r) && (index->c == local_120.c)) && (index->i == local_120.i)) &&
     ((index->m).ptr == local_120.m.ptr)) {
    bVar8 = QWidget::hasFocus(this_00);
    if (!bVar8) {
      bVar8 = QWidget::hasFocus((this->super_QAbstractItemViewPrivate).
                                super_QAbstractScrollAreaPrivate.viewport);
      if (!bVar8) goto LAB_00584f01;
    }
    QAbstractItemView::currentIndex(&local_120,(QAbstractItemView *)this_00);
    if (((-1 < local_120.r) && (-1 < local_120.c)) && (local_120.m.ptr != (QAbstractItemModel *)0x0)
       ) {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
           local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 1;
    }
  }
LAB_00584f01:
  pQVar6 = QWidget::style(this_00);
  (**(code **)(*(long *)pQVar6 + 0xb0))(pQVar6,0x2d,&local_108,painter,this_00);
  plVar7 = (long *)(**(code **)(*(long *)this_00 + 0x208))(this_00,index);
  (**(code **)(*plVar7 + 0x60))(plVar7,painter,&local_108,index);
  QBrush::~QBrush(&local_108.backgroundBrush);
  if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_108.icon);
  QLocale::~QLocale(&local_108.locale);
  QFont::~QFont(&local_108.font);
  QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::drawCell(QPainter *painter, const QStyleOptionViewItem &option, const QModelIndex &index)
{
    Q_Q(QTableView);
    QStyleOptionViewItem opt = option;

    if (selectionModel && selectionModel->isSelected(index))
        opt.state |= QStyle::State_Selected;
    if (index == hover)
        opt.state |= QStyle::State_MouseOver;
    if (option.state & QStyle::State_Enabled) {
        QPalette::ColorGroup cg;
        if ((model->flags(index) & Qt::ItemIsEnabled) == 0) {
            opt.state &= ~QStyle::State_Enabled;
            cg = QPalette::Disabled;
        } else {
            cg = QPalette::Normal;
        }
        opt.palette.setCurrentColorGroup(cg);
    }

    if (index == q->currentIndex()) {
        const bool focus = (q->hasFocus() || viewport->hasFocus()) && q->currentIndex().isValid();
        if (focus)
            opt.state |= QStyle::State_HasFocus;
    }

    q->style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, q);

    q->itemDelegateForIndex(index)->paint(painter, opt, index);
}